

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

void TweakAnnotationPlane(ON_Plane *plane)

{
  ON_3dVector local_30;
  undefined8 local_18;
  double too_big;
  ON_Plane *plane_local;
  
  local_18 = 0x4202a05f20000000;
  if (10000000000.0 < ABS((plane->origin).x)) {
    (plane->origin).x = 0.0;
  }
  if (10000000000.0 < ABS((plane->origin).y)) {
    (plane->origin).y = 0.0;
  }
  if (10000000000.0 < ABS((plane->origin).z)) {
    (plane->origin).z = 0.0;
  }
  if (10000000000.0 < ABS((plane->xaxis).x)) {
    (plane->xaxis).x = 1.0;
  }
  if (10000000000.0 < ABS((plane->xaxis).y)) {
    (plane->xaxis).y = 0.0;
  }
  if (10000000000.0 < ABS((plane->xaxis).z)) {
    (plane->xaxis).z = 0.0;
  }
  if (10000000000.0 < ABS((plane->yaxis).x)) {
    (plane->yaxis).x = 0.0;
  }
  if (10000000000.0 < ABS((plane->yaxis).y)) {
    (plane->yaxis).y = 1.0;
  }
  if (10000000000.0 < ABS((plane->yaxis).z)) {
    (plane->yaxis).z = 0.0;
  }
  too_big = (double)plane;
  ON_3dVector::Unitize(&plane->xaxis);
  ON_3dVector::Unitize((ON_3dVector *)((long)too_big + 0x30));
  ON_CrossProduct(&local_30,(ON_3dVector *)((long)too_big + 0x18),
                  (ON_3dVector *)((long)too_big + 0x30));
  *(double *)((long)too_big + 0x48) = local_30.x;
  *(double *)((long)too_big + 0x50) = local_30.y;
  *(double *)((long)too_big + 0x58) = local_30.z;
  ON_3dVector::Unitize((ON_3dVector *)((long)too_big + 0x48));
  ON_Plane::UpdateEquation((ON_Plane *)too_big);
  return;
}

Assistant:

static
void TweakAnnotationPlane( ON_Plane& plane )
{
  // 10 November 2003 Dale Lear
  //   Fixed lots of bugs in annotation plane tweaking.
  //   Before the fix this block of code was cut-n-pasted 
  //   in three places.  The fabs() calls were wrong.  In addition
  //   and the
  //   .x values where tested and then the .y/.z values were set.

  //    if( fabs( plane.origin.x > 1e10 ))
  //      plane.origin.x = 0.0;
  //    if( fabs( plane.origin.y > 1e10 ))
  //      plane.origin.y = 0.0;
  //    if( fabs( plane.origin.z > 1e10 ))
  //      plane.origin.z = 0.0;
  //    
  //    if( fabs( plane.xaxis.x > 1e10 ))
  //      plane.xaxis.x = 1.0;
  //    if( fabs( plane.xaxis.x > 1e10 ))
  //      plane.xaxis.y = 0.0;
  //    if( fabs( plane.xaxis.x > 1e10 ))
  //      plane.xaxis.z = 0.0;
  //    
  //    if( fabs( plane.yaxis.x > 1e10 ))
  //      plane.yaxis.x = 0.0;
  //    if( fabs( plane.yaxis.x > 1e10 ))
  //      plane.yaxis.y = 1.0;
  //    if( fabs( plane.yaxis.x > 1e10 ))
  //      plane.yaxis.z = 0.0;

  // Lowell has decided that annotation plane
  // coordinates bigger than "too_big" should be
  // set to zero.
  const double too_big = 1.0e10;

  if( fabs( plane.origin.x ) > too_big )
    plane.origin.x = 0.0;
  if( fabs( plane.origin.y ) > too_big )
    plane.origin.y = 0.0;
  if( fabs( plane.origin.z ) > too_big )
    plane.origin.z = 0.0;
  
  if( fabs( plane.xaxis.x ) > too_big )
    plane.xaxis.x = 1.0;
  if( fabs( plane.xaxis.y ) > too_big )
    plane.xaxis.y = 0.0;
  if( fabs( plane.xaxis.z ) > too_big )
    plane.xaxis.z = 0.0;
  
  if( fabs( plane.yaxis.x ) > too_big )
    plane.yaxis.x = 0.0;
  if( fabs( plane.yaxis.y ) > too_big )
    plane.yaxis.y = 1.0;
  if( fabs( plane.yaxis.z ) > too_big )
    plane.yaxis.z = 0.0;

  plane.xaxis.Unitize();
  plane.yaxis.Unitize();
  plane.zaxis = ON_CrossProduct(plane.xaxis,plane.yaxis);
  plane.zaxis.Unitize();
  plane.UpdateEquation();
}